

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeleton.cpp
# Opt level: O0

Info * __thiscall CS248::DynamicScene::Skeleton::getInfo_abi_cxx11_(Skeleton *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  Info *in_RDI;
  Info *info;
  value_type *__x;
  Info *__x_00;
  undefined1 local_68 [47];
  undefined1 local_39 [40];
  undefined1 local_11;
  
  local_11 = 0;
  __x_00 = in_RDI;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x2116b5);
  if (((in_RSI->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) ||
     (*(long *)((long)&(in_RSI->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish[1].field_2 + 8) == 0)) {
    __x = (value_type *)local_39;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_39 + 1),"SKELETON",(allocator *)__x);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_RDI,__x);
    std::__cxx11::string::~string((string *)(local_39 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_39);
  }
  else {
    (**(code **)(**(long **)((long)&(in_RSI->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish[1].field_2 + 8) +
                0x18))(local_68);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(in_RSI,__x_00);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(in_RSI);
  }
  return __x_00;
}

Assistant:

Info Skeleton::getInfo() {
  Info info;

  if (!scene || !scene->selected.element) {
    info.push_back("SKELETON");
  } else {
    info = scene->selected.element->getInfo();
  }

  return info;
}